

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

int __thiscall EvaluatorMopUp::Evaluate(EvaluatorMopUp *this,Position *pos)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  uint j;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  uint local_4c;
  
  fVar8 = Material::GetPhase(&pos->m_Material);
  if (fVar8 < 0.9) {
    return 0;
  }
  local_4c = 0;
  iVar3 = 0;
  uVar6 = 0;
  uVar7 = 0;
  iVar2 = 0;
  do {
    iVar4 = 0;
    uVar5 = local_4c;
    do {
      iVar1 = (*(pos->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.
                _vptr_BoardBase[1])(&pos->m_Board,(ulong)uVar5);
      if ((King *)CONCAT44(extraout_var,iVar1) == &WhiteKing) {
        iVar3 = iVar4;
        uVar6 = local_4c;
      }
      if ((King *)CONCAT44(extraout_var,iVar1) == &BlackKing) {
        uVar7 = local_4c;
        iVar2 = iVar4;
      }
      iVar4 = iVar4 + 1;
      uVar5 = uVar5 + 8;
    } while (iVar4 != 8);
    local_4c = local_4c + 1;
  } while (local_4c != 8);
  iVar1 = uVar6 - uVar7;
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  iVar3 = iVar3 - iVar2;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar2 = (*(this->super_EvaluatorBase)._vptr_EvaluatorBase[1])
                    (this,pos,(ulong)(uint)((6 - (iVar2 + iVar4)) * 100));
  return iVar2;
}

Assistant:

virtual int Evaluate( Position &pos ) const
    {
        const float fTurnOnAt = 0.9f;

        if ( pos.GetPhase() < fTurnOnAt )
            return 0;

        Square localWhiteKing, localBlackKing;

        for ( unsigned int i = 0; i < MAX_FILES; i++ )
        {
            for ( unsigned int j = 0; j < MAX_FILES; j++ )
            {
                Square cur( i, j );
                const Piece *pPiece = pos.GetBoard().Get( cur );

                if ( pPiece == &WhiteKing )
                    localWhiteKing = cur;

                if ( pPiece == &BlackKing )
                    localBlackKing = cur;
            }
        }

        return Bias( pos, ( 6 - localWhiteKing.ManhattanDistanceTo(
                                localBlackKing ) ) * 100 );
    }